

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O2

uint32_t arm_asr(status_register_t *cpsr,uint32_t data,uint32_t shift_amount)

{
  if (shift_amount != 0) {
    if (0x1f < shift_amount) {
      if (cpsr != (status_register_t *)0x0) {
        cpsr->raw = cpsr->raw & 0xdfffffff | data >> 2 & 0x20000000;
      }
      return (int)data >> 0x1f;
    }
    if (cpsr != (status_register_t *)0x0) {
      cpsr->raw = cpsr->raw & 0xdfffffff | (data >> ((byte)shift_amount - 1 & 0x1f) & 1) << 0x1d;
    }
    data = (int)data >> ((byte)shift_amount & 0x1f);
  }
  return data;
}

Assistant:

word arm_asr(status_register_t* cpsr, word data, word shift_amount) {
    word result;
    if (shift_amount == 0) {
        result = data;
    } else {
        if (shift_amount < 32) {
            if (cpsr) {
                cpsr->C = (data >> (shift_amount - 1u)) & 1u;
            }
            int32_t signed_data = data;
            signed_data >>= shift_amount;
            result = signed_data;
        }
        else {
            int32_t signed_data = data;
            signed_data >>= 31u;
            result = signed_data;

            if (cpsr) {
                cpsr->C = result & 1u;
            }
        }
    }

    return result;
}